

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rowSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  int iVar1;
  undefined4 *in_RDI;
  int *sing;
  int *rperm;
  int *idx;
  int lk;
  int rs;
  int len;
  int p_col;
  int p_row;
  int r;
  int ll;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pval;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffd88;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffd90;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdb0;
  undefined1 local_1d0 [128];
  long local_150;
  long local_148;
  long local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  reference local_68;
  cpp_dec_float<200U,_int,_void> *local_60;
  reference local_58;
  reference local_50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  reference local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  reference local_10;
  undefined1 *local_8;
  
  local_88 = &local_110;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffd90);
  local_148 = *(long *)(in_RDI + 0xa6);
  local_150 = *(long *)(in_RDI + 0x10e);
  local_134 = in_RDI[0x118];
  for (local_114 = 0; local_114 < (int)in_RDI[1]; local_114 = local_114 + 1) {
    if ((*(int *)(local_148 + (long)local_114 * 4) < 0) &&
       (*(int *)(*(long *)(in_RDI + 0xe8) + (long)local_114 * 4) == 1)) {
      iVar1 = in_RDI[0x118];
      in_RDI[0x118] = iVar1 + 1;
      *(int *)(local_150 + (long)iVar1 * 4) = local_114;
    }
  }
  do {
    if ((int)in_RDI[0x118] <= local_134) {
      return;
    }
    local_128 = *(int *)(local_150 + (long)local_134 * 4);
    local_118 = *(int *)(*(long *)(in_RDI + 0xe6) + (long)local_128 * 4);
    local_12c = *(int *)(*(long *)(in_RDI + 0xe4) + (long)local_118 * 4);
    local_50 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)(in_RDI + 0xde),(long)local_118);
    local_48 = &local_110;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    local_78 = local_1d0;
    local_80 = &local_110;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    setPivot((CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)pval.m_backend.data._M_elems._88_8_,pval.m_backend.data._M_elems[0x15],
             pval.m_backend.data._M_elems[0x14],pval.m_backend.data._M_elems[0x13],
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)pval.m_backend.data._M_elems._64_8_);
    *(undefined4 *)(*(long *)(in_RDI + 0xe8) + (long)local_128 * 4) = 0;
    local_140 = *(long *)(in_RDI + 0xf6) +
                (long)*(int *)(*(long *)(in_RDI + 0xfe) + (long)local_12c * 4) * 4;
    local_114 = *(int *)(*(long *)(in_RDI + 0x116) + (long)local_12c * 4);
    local_138 = makeLvec(in_stack_fffffffffffffdb0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    local_130 = *(int *)(*(long *)(in_RDI + 0x100) + (long)local_12c * 4);
    local_114 = *(int *)(*(long *)(in_RDI + 0x100) + (long)local_12c * 4) - local_114;
    *(int *)(*(long *)(in_RDI + 0x100) + (long)local_12c * 4) = local_114;
    for (; local_114 < local_130; local_114 = local_114 + 1) {
      local_124 = *(int *)(local_140 + (long)local_114 * 4);
      if (local_124 != local_128) {
        local_120 = *(int *)(*(long *)(in_RDI + 0xe8) + (long)local_124 * 4) + -1;
        *(int *)(*(long *)(in_RDI + 0xe8) + (long)local_124 * 4) = local_120;
        local_11c = *(int *)(*(long *)(in_RDI + 0xe6) + (long)local_124 * 4) + local_120;
        local_118 = local_11c;
        while (*(int *)(*(long *)(in_RDI + 0xe4) + (long)local_118 * 4) != local_12c) {
          local_118 = local_118 + -1;
        }
        *(int *)(*(long *)(in_RDI + 0xb4) + (long)local_138 * 4) = local_124;
        local_30 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI + 0xde),(long)local_118);
        local_28 = &stack0xfffffffffffffdb0;
        local_38 = &local_110;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30,local_38);
        local_20 = &stack0xfffffffffffffdb0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffffd90);
        local_8 = &stack0xfffffffffffffdb0;
        local_10 = local_30;
        local_18 = local_38;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                   (cpp_dec_float<200U,_int,_void> *)0x6d4910);
        local_68 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI + 0xae),(long)local_138);
        local_70 = &stack0xfffffffffffffdb0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        local_138 = local_138 + 1;
        *(undefined4 *)(*(long *)(in_RDI + 0xe4) + (long)local_118 * 4) =
             *(undefined4 *)(*(long *)(in_RDI + 0xe4) + (long)local_11c * 4);
        in_stack_fffffffffffffd90 =
             &std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            *)(in_RDI + 0xde),(long)local_11c)->m_backend;
        local_58 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI + 0xde),(long)local_118);
        local_60 = in_stack_fffffffffffffd90;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        if (local_120 == 1) {
          iVar1 = in_RDI[0x118];
          in_RDI[0x118] = iVar1 + 1;
          *(int *)(local_150 + (long)iVar1 * 4) = local_124;
        }
        else if (local_120 == 0) {
          *in_RDI = 2;
          return;
        }
      }
    }
    local_134 = local_134 + 1;
  } while( true );
}

Assistant:

void CLUFactor<R>::rowSingletons()
{
   R pval;
   int i, j, k, ll, r;
   int p_row, p_col, len, rs, lk;
   int* idx;
   int* rperm = row.perm;
   int* sing = temp.s_mark;

   /*  Mark row singletons
    */
   rs = temp.stage;

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0 && u.row.len[i] == 1)
         sing[temp.stage++] = i;
   }

   /*  Eliminate row singletons
    *  thereby marking newly arising ones
    *  until no more can be found.
    */
   for(; rs < temp.stage; ++rs)
   {
      /*      Move pivot element from row file to diag
       */
      p_row = sing[rs];
      j = u.row.start[p_row];
      p_col = u.row.idx[j];
      pval = u.row.val[j];
      setPivot(rs, p_col, p_row, pval);
      u.row.len[p_row] = 0;

      /*      Remove pivot column form workingmatrix
       *      thereby building up L VectorBase<R>.
       */
      idx = &(u.col.idx[u.col.start[p_col]]);
      i = temp.s_cact[p_col];                /* nr. nonzeros of new L VectorBase<R> */
      lk = makeLvec(i - 1, p_row);
      len = u.col.len[p_col];
      i = (u.col.len[p_col] -= i);         /* remove pivot column from U */

      for(; i < len; ++i)
      {
         r = idx[i];

         if(r != p_row)
         {
            /*      Find pivot column in row.
             */
            ll = --(u.row.len[r]);
            k = u.row.start[r] + ll;

            for(j = k; u.row.idx[j] != p_col; --j)
               ;

            assert(k >= u.row.start[r]);

            /*      Initialize L VectorBase<R>
             */
            l.idx[lk] = r;

            l.val[lk] = u.row.val[j] / pval;

            ++lk;

            /*      Remove pivot column from row.
             */
            u.row.idx[j] = u.row.idx[k];

            u.row.val[j] = u.row.val[k];

            /*      Check new row length.
             */
            if(ll == 1)
               sing[temp.stage++] = r;
            else if(ll == 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }
         }
      }
   }
}